

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngmem.c
# Opt level: O2

void png_destroy_png_struct(png_structrp png_ptr)

{
  png_struct dummy_struct;
  png_struct local_500;
  
  if (png_ptr != (png_structrp)0x0) {
    memcpy(&local_500,png_ptr,0x4f0);
    memset(png_ptr,0,0x4f0);
    png_free(&local_500,png_ptr);
    png_free_jmpbuf(&local_500);
  }
  return;
}

Assistant:

void /* PRIVATE */
png_destroy_png_struct(png_structrp png_ptr)
{
   if (png_ptr != NULL)
   {
      /* png_free might call png_error and may certainly call
       * png_get_mem_ptr, so fake a temporary png_struct to support this.
       */
      png_struct dummy_struct = *png_ptr;
      memset(png_ptr, 0, (sizeof *png_ptr));
      png_free(&dummy_struct, png_ptr);

#     ifdef PNG_SETJMP_SUPPORTED
         /* We may have a jmp_buf left to deallocate. */
         png_free_jmpbuf(&dummy_struct);
#     endif
   }
}